

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

int * __thiscall ring_buffer<int>::front(ring_buffer<int> *this)

{
  runtime_error *this_00;
  reference pvVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ring buffer is empty");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),
                      *(size_type *)(in_RDI + 0x10));
  return pvVar1;
}

Assistant:

T & front() {
        if (sz == 0) {
            throw std::runtime_error("ring buffer is empty");
        }
        return data[first];
    }